

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O2

Vec_Ptr_t * Sim_SimulateSeqRandom(Abc_Ntk_t *pNtk,int nFrames,int nWords)

{
  Vec_Ptr_t *vInfo;
  Abc_Obj_t *pAVar1;
  int iVar2;
  uint *pPatRand;
  int iVar3;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSeq.c"
                  ,0x38,"Vec_Ptr_t *Sim_SimulateSeqRandom(Abc_Ntk_t *, int, int)");
  }
  iVar2 = nWords * nFrames;
  vInfo = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,iVar2,0);
  pAVar1 = Abc_AigConst1(pNtk);
  Sim_UtilSetConst((uint *)vInfo->pArray[pAVar1->Id],iVar2,1);
  for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
    pAVar1 = Abc_NtkPi(pNtk,iVar3);
    Sim_UtilSetRandom((uint *)vInfo->pArray[pAVar1->Id],iVar2);
  }
  iVar2 = 0;
  do {
    if (pNtk->vBoxes->nSize <= iVar2) {
      iVar2 = nFrames + -1;
      iVar3 = 0;
      if (nFrames < 1) {
        nFrames = 0;
      }
      for (; nFrames != iVar3; iVar3 = iVar3 + 1) {
        Sim_SimulateSeqFrame(vInfo,pNtk,iVar3,nWords,(uint)(iVar3 < iVar2));
      }
      return vInfo;
    }
    pAVar1 = Abc_NtkBox(pNtk,iVar2);
    if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
      iVar3 = Abc_LatchIsInit0(pAVar1);
      if (iVar3 == 0) {
        iVar3 = Abc_LatchIsInit1(pAVar1);
        pPatRand = (uint *)vInfo->pArray[pAVar1->Id];
        if (iVar3 == 0) {
          Sim_UtilSetRandom(pPatRand,nWords);
          goto LAB_004066c5;
        }
        iVar3 = 1;
      }
      else {
        pPatRand = (uint *)vInfo->pArray[pAVar1->Id];
        iVar3 = 0;
      }
      Sim_UtilSetConst(pPatRand,nWords,iVar3);
    }
LAB_004066c5:
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Sim_SimulateSeqRandom( Abc_Ntk_t * pNtk, int nFrames, int nWords )
{
    Vec_Ptr_t * vInfo;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    vInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nWords * nFrames, 0 );
    // set the constant data
    pNode = Abc_AigConst1(pNtk);
    Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords * nFrames, 1 );
    // set the random PI data
    Abc_NtkForEachPi( pNtk, pNode, i )
        Sim_UtilSetRandom( Sim_SimInfoGet(vInfo,pNode), nWords * nFrames );
    // set the initial state data
    Abc_NtkForEachLatch( pNtk, pNode, i )
        if ( Abc_LatchIsInit0(pNode) )
            Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords, 0 );
        else if ( Abc_LatchIsInit1(pNode) )
            Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords, 1 );
        else 
            Sim_UtilSetRandom( Sim_SimInfoGet(vInfo,pNode), nWords );
    // simulate the nodes for the given number of timeframes
    for ( i = 0; i < nFrames; i++ )
        Sim_SimulateSeqFrame( vInfo, pNtk, i, nWords, (int)(i < nFrames-1) );
    return vInfo;
}